

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

SourceTextModuleRecord * __thiscall
Js::JavascriptLibrary::GetModuleRecord(JavascriptLibrary *this,uint moduleId)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  
  this_00 = (this->moduleRecordList).ptr;
  uVar3 = (this_00->
          super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).count
  ;
  if ((int)uVar3 < 0 || uVar3 <= moduleId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1c9c,
                                "((moduleRecordList->Count() >= 0) && (moduleId < (uint)moduleRecordList->Count()))"
                                ,
                                "(moduleRecordList->Count() >= 0) && (moduleId < (uint)moduleRecordList->Count())"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    this_00 = (this->moduleRecordList).ptr;
    uVar3 = (this_00->
            super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
            count;
  }
  if (moduleId < uVar3) {
    pTVar5 = JsUtil::
             List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_00,moduleId);
    return pTVar5->ptr;
  }
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

SourceTextModuleRecord* JavascriptLibrary::GetModuleRecord(uint moduleId)
    {
        Assert((moduleRecordList->Count() >= 0) && (moduleId < (uint)moduleRecordList->Count()));
        if (moduleId >= (uint)moduleRecordList->Count())
        {
            Js::Throw::FatalInternalError();
        }
        return moduleRecordList->Item(moduleId);
    }